

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseNumber
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  StringPiece message;
  undefined1 local_58 [8];
  Status result;
  NumberResult number;
  
  ParseNumberHelper((Status *)local_58,this,
                    (NumberResult *)((long)&result.error_message_.field_2 + 8));
  if (local_58._0_4_ == OK) {
    if (result.error_message_.field_2._8_4_ == 0) {
      (*this->ow_->_vptr_ObjectWriter[0xb])
                (number.type,this->ow_,(this->key_).ptr_,(this->key_).length_);
    }
    else if (result.error_message_.field_2._8_4_ == 1) {
      (*this->ow_->_vptr_ObjectWriter[9])
                (this->ow_,(this->key_).ptr_,(this->key_).length_,number._0_8_);
    }
    else {
      if (result.error_message_.field_2._8_4_ != 2) {
        message.length_ = 0x17;
        message.ptr_ = "Unable to parse number.";
        ReportFailure(__return_storage_ptr__,this,message);
        goto LAB_0031afeb;
      }
      (*this->ow_->_vptr_ObjectWriter[10])
                (this->ow_,(this->key_).ptr_,(this->key_).length_,number._0_8_);
    }
    (this->key_).ptr_ = (char *)0x0;
    (this->key_).length_ = 0;
  }
  Status::Status(__return_storage_ptr__,(Status *)local_58);
LAB_0031afeb:
  if ((size_type *)result._0_8_ != &result.error_message_._M_string_length) {
    operator_delete((void *)result._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseNumber() {
  NumberResult number;
  util::Status result = ParseNumberHelper(&number);
  if (result.ok()) {
    switch (number.type) {
      case NumberResult::DOUBLE:
        ow_->RenderDouble(key_, number.double_val);
        key_ = StringPiece();
        break;

      case NumberResult::INT:
        ow_->RenderInt64(key_, number.int_val);
        key_ = StringPiece();
        break;

      case NumberResult::UINT:
        ow_->RenderUint64(key_, number.uint_val);
        key_ = StringPiece();
        break;

      default:
        return ReportFailure("Unable to parse number.");
    }
  }
  return result;
}